

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::PackUnorm2x16Case::PackUnorm2x16Case
          (PackUnorm2x16Case *this,TestContext *testCtx,ShaderType shaderType,Precision precision)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  size_type *psVar4;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  Symbol local_68;
  
  local_88[0] = (undefined1 *)((long)&((VarType *)local_88)->m_data + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"packunorm2x16","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_88);
  paVar1 = &local_a8.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8.field_2._8_8_ = plVar3[3];
    local_a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_a8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
  paVar2 = &local_68.name.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_68.name.field_2._M_allocated_capacity = *psVar4;
    local_68.name.field_2._8_8_ = plVar3[3];
    local_68.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_68.name.field_2._M_allocated_capacity = *psVar4;
    local_68.name._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_68.name._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ShaderPackingFunctionCase::ShaderPackingFunctionCase
            (&this->super_ShaderPackingFunctionCase,testCtx,local_68.name._M_dataplus._M_p,
             "packUnorm2x16",shaderType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] != (undefined1 *)((long)&((VarType *)local_88)->m_data + 8U)) {
    operator_delete(local_88[0],local_78._0_8_ + 1);
  }
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderPackingFunctionCase_00d05e30;
  this->m_precision = precision;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"in0","");
  glu::VarType::VarType((VarType *)local_88,TYPE_FLOAT_VEC2,precision);
  Symbol::Symbol(&local_68,&local_a8,(VarType *)local_88);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_68);
  glu::VarType::~VarType(&local_68.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType((VarType *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"out0","");
  glu::VarType::VarType((VarType *)local_88,TYPE_UINT,PRECISION_HIGHP);
  Symbol::Symbol(&local_68,&local_a8,(VarType *)local_88);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_68);
  glu::VarType::~VarType(&local_68.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType((VarType *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderPackingFunctionCase).m_spec.source,0,
             (char *)(this->super_ShaderPackingFunctionCase).m_spec.source._M_string_length,0xb2d6ef
            );
  return;
}

Assistant:

PackUnorm2x16Case (tcu::TestContext& testCtx, glu::ShaderType shaderType, glu::Precision precision)
		: ShaderPackingFunctionCase	(testCtx, (string("packunorm2x16") + getPrecisionPostfix(precision) + getShaderTypePostfix(shaderType)).c_str(), "packUnorm2x16", shaderType)
		, m_precision				(precision)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_FLOAT_VEC2, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));

		m_spec.source = "out0 = packUnorm2x16(in0);";
	}